

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

Expression * __thiscall hdc::Parser::parse_primary_expression(Parser *this)

{
  Token *pTVar1;
  pointer pcVar2;
  bool bVar3;
  TokenKind TVar4;
  IdentifierExpression *this_00;
  Expression *pEVar5;
  IdentifierExpression *expression;
  _Alloc_hider _Var6;
  char *pcVar7;
  Token oper;
  undefined1 local_240 [16];
  _Alloc_hider local_230;
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  undefined1 local_210 [16];
  _Alloc_hider local_200;
  char local_1f0 [16];
  undefined1 local_1e0 [16];
  _Alloc_hider local_1d0;
  char local_1c0 [16];
  undefined1 local_1b0 [16];
  _Alloc_hider local_1a0;
  char local_190 [16];
  undefined1 local_180 [16];
  _Alloc_hider local_170;
  char local_160 [16];
  undefined1 local_150 [16];
  _Alloc_hider local_140;
  char local_130 [16];
  undefined1 local_120 [16];
  _Alloc_hider local_110;
  char local_100 [16];
  undefined1 local_f0 [16];
  _Alloc_hider local_e0;
  char local_d0 [16];
  undefined1 local_c0 [16];
  _Alloc_hider local_b0;
  char local_a0 [16];
  undefined1 local_90 [16];
  _Alloc_hider local_80;
  char local_70 [16];
  undefined1 local_60 [16];
  _Alloc_hider local_50;
  char local_40 [16];
  
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  local_230._M_p = (pointer)&local_220;
  bVar3 = match(this,TK_LEFT_PARENTHESIS);
  if (bVar3) {
    pTVar1 = (this->matched)._M_current;
    local_240._8_4_ = pTVar1->column;
    local_240._0_4_ = pTVar1->kind;
    local_240._4_4_ = pTVar1->line;
    std::__cxx11::string::_M_assign((string *)&local_230);
    this_00 = (IdentifierExpression *)operator_new(0x60);
    pEVar5 = parse_assignment_expression(this);
    ParenthesisExpression::ParenthesisExpression
              ((ParenthesisExpression *)this_00,(Token *)local_240,pEVar5);
    expect(this,TK_RIGHT_PARENTHESIS);
    goto LAB_0014f33b;
  }
  bVar3 = match(this,TK_DOLAR);
  if (bVar3) {
    pTVar1 = (this->matched)._M_current;
    local_240._8_4_ = pTVar1->column;
    local_240._0_4_ = pTVar1->kind;
    local_240._4_4_ = pTVar1->line;
    std::__cxx11::string::_M_assign((string *)&local_230);
    expect(this,TK_LITERAL_STRING);
    this_00 = (IdentifierExpression *)operator_new(0x60);
    pEVar5 = (Expression *)operator_new(0x58);
    pTVar1 = (this->matched)._M_current;
    local_60._8_4_ = pTVar1->column;
    local_60._0_4_ = pTVar1->kind;
    local_60._4_4_ = pTVar1->line;
    pcVar2 = (pTVar1->lexem)._M_dataplus._M_p;
    local_50._M_p = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + (pTVar1->lexem)._M_string_length);
    LiteralStringExpression::LiteralStringExpression
              ((LiteralStringExpression *)pEVar5,(Token *)local_60);
    DolarExpression::DolarExpression((DolarExpression *)this_00,(Token *)local_240,pEVar5);
    _Var6._M_p = local_50._M_p;
    if (local_50._M_p == local_40) goto LAB_0014f33b;
  }
  else {
    bVar3 = match(this,TK_AT);
    if (bVar3) {
      pTVar1 = (this->matched)._M_current;
      local_240._8_4_ = pTVar1->column;
      local_240._0_4_ = pTVar1->kind;
      local_240._4_4_ = pTVar1->line;
      std::__cxx11::string::_M_assign((string *)&local_230);
      this_00 = (IdentifierExpression *)operator_new(0x60);
      expression = parse_identifier_expression(this);
      AtExpression::AtExpression
                ((AtExpression *)this_00,(Token *)local_240,&expression->super_Expression);
      goto LAB_0014f33b;
    }
    bVar3 = match(this,TK_LITERAL_INTEGER);
    if (bVar3) {
      this_00 = (IdentifierExpression *)operator_new(0x58);
      pTVar1 = (this->matched)._M_current;
      local_90._8_4_ = pTVar1->column;
      local_90._0_4_ = pTVar1->kind;
      local_90._4_4_ = pTVar1->line;
      pcVar7 = local_70;
      pcVar2 = (pTVar1->lexem)._M_dataplus._M_p;
      local_80._M_p = pcVar7;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,pcVar2,pcVar2 + (pTVar1->lexem)._M_string_length);
      LiteralIntegerExpression::LiteralIntegerExpression
                ((LiteralIntegerExpression *)this_00,(Token *)local_90);
      _Var6._M_p = local_80._M_p;
    }
    else {
      bVar3 = match(this,TK_LITERAL_CHAR);
      if (bVar3) {
        this_00 = (IdentifierExpression *)operator_new(0x58);
        pTVar1 = (this->matched)._M_current;
        local_c0._8_4_ = pTVar1->column;
        local_c0._0_4_ = pTVar1->kind;
        local_c0._4_4_ = pTVar1->line;
        pcVar7 = local_a0;
        pcVar2 = (pTVar1->lexem)._M_dataplus._M_p;
        local_b0._M_p = pcVar7;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,pcVar2,pcVar2 + (pTVar1->lexem)._M_string_length);
        LiteralCharExpression::LiteralCharExpression
                  ((LiteralCharExpression *)this_00,(Token *)local_c0);
        _Var6._M_p = local_b0._M_p;
      }
      else {
        bVar3 = match(this,TK_LITERAL_FLOAT);
        if (bVar3) {
          this_00 = (IdentifierExpression *)operator_new(0x58);
          pTVar1 = (this->matched)._M_current;
          local_f0._8_4_ = pTVar1->column;
          local_f0._0_4_ = pTVar1->kind;
          local_f0._4_4_ = pTVar1->line;
          pcVar7 = local_d0;
          pcVar2 = (pTVar1->lexem)._M_dataplus._M_p;
          local_e0._M_p = pcVar7;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e0,pcVar2,pcVar2 + (pTVar1->lexem)._M_string_length);
          LiteralFloatExpression::LiteralFloatExpression
                    ((LiteralFloatExpression *)this_00,(Token *)local_f0);
          _Var6._M_p = local_e0._M_p;
        }
        else {
          bVar3 = match(this,TK_LITERAL_DOUBLE);
          if (bVar3) {
            this_00 = (IdentifierExpression *)operator_new(0x58);
            pTVar1 = (this->matched)._M_current;
            local_120._8_4_ = pTVar1->column;
            local_120._0_4_ = pTVar1->kind;
            local_120._4_4_ = pTVar1->line;
            pcVar7 = local_100;
            pcVar2 = (pTVar1->lexem)._M_dataplus._M_p;
            local_110._M_p = pcVar7;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_110,pcVar2,pcVar2 + (pTVar1->lexem)._M_string_length);
            LiteralDoubleExpression::LiteralDoubleExpression
                      ((LiteralDoubleExpression *)this_00,(Token *)local_120);
            _Var6._M_p = local_110._M_p;
          }
          else {
            bVar3 = match(this,TK_LITERAL_STRING);
            if (bVar3) {
              this_00 = (IdentifierExpression *)operator_new(0x58);
              pTVar1 = (this->matched)._M_current;
              local_150._8_4_ = pTVar1->column;
              local_150._0_4_ = pTVar1->kind;
              local_150._4_4_ = pTVar1->line;
              pcVar7 = local_130;
              pcVar2 = (pTVar1->lexem)._M_dataplus._M_p;
              local_140._M_p = pcVar7;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_140,pcVar2,pcVar2 + (pTVar1->lexem)._M_string_length);
              LiteralStringExpression::LiteralStringExpression
                        ((LiteralStringExpression *)this_00,(Token *)local_150);
              _Var6._M_p = local_140._M_p;
            }
            else {
              bVar3 = match(this,TK_LITERAL_SYMBOL);
              if (bVar3) {
                this_00 = (IdentifierExpression *)operator_new(0x58);
                pTVar1 = (this->matched)._M_current;
                local_180._8_4_ = pTVar1->column;
                local_180._0_4_ = pTVar1->kind;
                local_180._4_4_ = pTVar1->line;
                pcVar7 = local_160;
                pcVar2 = (pTVar1->lexem)._M_dataplus._M_p;
                local_170._M_p = pcVar7;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_170,pcVar2,pcVar2 + (pTVar1->lexem)._M_string_length);
                LiteralSymbolExpression::LiteralSymbolExpression
                          ((LiteralSymbolExpression *)this_00,(Token *)local_180);
                _Var6._M_p = local_170._M_p;
              }
              else {
                bVar3 = match(this,TK_NULL);
                if (bVar3) {
                  this_00 = (IdentifierExpression *)operator_new(0x58);
                  pTVar1 = (this->matched)._M_current;
                  local_1b0._8_4_ = pTVar1->column;
                  local_1b0._0_4_ = pTVar1->kind;
                  local_1b0._4_4_ = pTVar1->line;
                  pcVar7 = local_190;
                  pcVar2 = (pTVar1->lexem)._M_dataplus._M_p;
                  local_1a0._M_p = pcVar7;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_1a0,pcVar2,pcVar2 + (pTVar1->lexem)._M_string_length);
                  LiteralNullExpression::LiteralNullExpression
                            ((LiteralNullExpression *)this_00,(Token *)local_1b0);
                  _Var6._M_p = local_1a0._M_p;
                }
                else {
                  bVar3 = match(this,TK_TRUE);
                  if (bVar3) {
                    this_00 = (IdentifierExpression *)operator_new(0x58);
                    pTVar1 = (this->matched)._M_current;
                    local_1e0._8_4_ = pTVar1->column;
                    local_1e0._0_4_ = pTVar1->kind;
                    local_1e0._4_4_ = pTVar1->line;
                    pcVar7 = local_1c0;
                    pcVar2 = (pTVar1->lexem)._M_dataplus._M_p;
                    local_1d0._M_p = pcVar7;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_1d0,pcVar2,pcVar2 + (pTVar1->lexem)._M_string_length
                              );
                    LiteralBoolExpression::LiteralBoolExpression
                              ((LiteralBoolExpression *)this_00,(Token *)local_1e0);
                    _Var6._M_p = local_1d0._M_p;
                  }
                  else {
                    bVar3 = match(this,TK_FALSE);
                    if (!bVar3) {
                      TVar4 = Token::getKind((this->current_token)._M_current);
                      if (TVar4 == TK_LEFT_SQUARE_BRACKET) {
                        this_00 = (IdentifierExpression *)parse_list_expression(this);
                      }
                      else {
                        TVar4 = Token::getKind((this->current_token)._M_current);
                        if (TVar4 == TK_LEFT_CURLY_BRACKET) {
                          this_00 = (IdentifierExpression *)parse_array_expression(this);
                        }
                        else {
                          this_00 = parse_identifier_expression(this);
                        }
                      }
                      goto LAB_0014f33b;
                    }
                    this_00 = (IdentifierExpression *)operator_new(0x58);
                    pTVar1 = (this->matched)._M_current;
                    local_210._8_4_ = pTVar1->column;
                    local_210._0_4_ = pTVar1->kind;
                    local_210._4_4_ = pTVar1->line;
                    pcVar7 = local_1f0;
                    pcVar2 = (pTVar1->lexem)._M_dataplus._M_p;
                    local_200._M_p = pcVar7;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_200,pcVar2,pcVar2 + (pTVar1->lexem)._M_string_length
                              );
                    LiteralBoolExpression::LiteralBoolExpression
                              ((LiteralBoolExpression *)this_00,(Token *)local_210);
                    _Var6._M_p = local_200._M_p;
                  }
                }
              }
            }
          }
        }
      }
    }
    if (_Var6._M_p == pcVar7) goto LAB_0014f33b;
  }
  operator_delete(_Var6._M_p);
LAB_0014f33b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_p != &local_220) {
    operator_delete(local_230._M_p);
  }
  return &this_00->super_Expression;
}

Assistant:

Expression* Parser::parse_primary_expression() {
    Expression* expression = NULL;
    Token oper;

    if (match(TK_LEFT_PARENTHESIS)) {
        oper = *matched;
        expression = new ParenthesisExpression(oper, parse_expression());
        expect(TK_RIGHT_PARENTHESIS);
    } else if (match(TK_DOLAR)) {
        oper = *matched;

        expect(TK_LITERAL_STRING);
        expression = new DolarExpression(oper, new LiteralStringExpression(*matched));
    } else if (match(TK_AT)) {
        oper = *matched;
        expression = new AtExpression(oper, parse_identifier_expression());
    } else if (match(TK_LITERAL_INTEGER)) {
        expression = new LiteralIntegerExpression(*matched);
    } else if (match(TK_LITERAL_CHAR)) {
        expression = new LiteralCharExpression(*matched);
    } else if (match(TK_LITERAL_FLOAT)) {
        expression = new LiteralFloatExpression(*matched);
    } else if (match(TK_LITERAL_DOUBLE)) {
        expression = new LiteralDoubleExpression(*matched);
    } else if (match(TK_LITERAL_STRING)) {
        expression = new LiteralStringExpression(*matched);
    } else if (match(TK_LITERAL_SYMBOL)) {
        expression = new LiteralSymbolExpression(*matched);
    } else if (match(TK_NULL)) {
        expression = new LiteralNullExpression(*matched);
    } else if (match(TK_TRUE)) {
        expression = new LiteralBoolExpression(*matched);
    } else if (match(TK_FALSE)) {
        expression = new LiteralBoolExpression(*matched);
    } else if (lookahead(TK_LEFT_SQUARE_BRACKET)) {
        expression = parse_list_expression();
    } else if (lookahead(TK_LEFT_CURLY_BRACKET)) {
        expression = parse_array_expression();
    } else {
        expression = parse_identifier_expression();
    }

    return expression; 
}